

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

string * __thiscall
cmOutputConverter::Shell_GetArgument_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view in,int flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  char cVar9;
  int iVar10;
  iterator cit;
  byte *c;
  byte *end;
  bool bVar11;
  string_view in_00;
  string ninjaConfigReplace;
  string local_70;
  string local_50;
  
  uVar6 = (uint)in._M_str;
  c = (byte *)in._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar7 = uVar6;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  in_00._M_str._4_4_ = 0;
  in_00._0_12_ = in._0_12_;
  bVar4 = Shell_ArgumentNeedsQuotes(this,in_00,uVar7);
  bVar8 = (byte)in._M_str;
  cVar9 = (char)__return_storage_ptr__;
  if (bVar4) {
    if (((char)bVar8 < '\0') && ((uVar6 >> 8 & 1) != 0)) {
      std::__cxx11::string::push_back(cVar9);
    }
    std::__cxx11::string::push_back(cVar9);
  }
  if (this == (cmOutputConverter *)0x0) {
    uVar7 = 0;
  }
  else {
    end = c + (long)&this->StateSnapshot;
    uVar7 = 0;
    do {
      if (((undefined1  [16])in & (undefined1  [16])0x40) != (undefined1  [16])0x0) {
        pbVar5 = (byte *)Shell_SkipMakeVariables((iterator)c,(iterator)end);
        if (pbVar5 == c) {
          bVar11 = true;
        }
        else {
          for (; c != pbVar5; c = c + 1) {
            std::__cxx11::string::push_back(cVar9);
          }
          bVar11 = c != end;
          uVar7 = 0;
        }
        if (!bVar11) break;
      }
      uVar3 = uVar7;
      if ((uVar6 >> 8 & 1) == 0) {
        if (((undefined1  [16])in & (undefined1  [16])0x4) == (undefined1  [16])0x0) {
          if (*c == 0x5c) {
            uVar3 = uVar7 + 1;
          }
          else {
            uVar3 = 0;
            if (*c == 0x22) {
              iVar10 = uVar7 + 1;
              while (iVar10 = iVar10 + -1, 0 < iVar10) {
                std::__cxx11::string::push_back(cVar9);
              }
              std::__cxx11::string::push_back(cVar9);
              uVar3 = (int)uVar7 >> 0x1f & uVar7;
            }
          }
        }
      }
      else if ((*c - 0x22 < 0x3f) && ((0x4400000000000005U >> ((ulong)(*c - 0x22) & 0x3f) & 1) != 0)
              ) {
        std::__cxx11::string::push_back(cVar9);
      }
      uVar7 = uVar3;
      bVar2 = *c;
      if (bVar2 < 0x25) {
        if (bVar2 == 0x23) {
          if ((uVar6 & 9) != 9) goto LAB_0024022d;
          goto LAB_0024025c;
        }
        if ((bVar2 == 0x24) &&
           (((undefined1  [16])in & (undefined1  [16])0x3) != (undefined1  [16])0x0))
        goto LAB_0024025c;
LAB_0024022d:
        std::__cxx11::string::push_back(cVar9);
      }
      else {
        if (bVar2 == 0x25) {
          if ((((undefined1  [16])in & (undefined1  [16])0x30) != (undefined1  [16])0x0 & bVar8) ==
              0 && (char)((uVar6 & 2) >> 1) == '\0') goto LAB_0024022d;
        }
        else if ((bVar2 != 0x3b) ||
                (((undefined1  [16])in & (undefined1  [16])0x2) == (undefined1  [16])0x0))
        goto LAB_0024022d;
LAB_0024025c:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      c = c + 1;
    } while (c != end);
  }
  if (bVar4) {
    iVar10 = uVar7 + 1;
    while (iVar10 = iVar10 + -1, 0 < iVar10) {
      std::__cxx11::string::push_back(cVar9);
    }
    if ((-1 < (char)bVar8) || (std::__cxx11::string::push_back(cVar9), (uVar6 >> 8 & 1) != 0)) {
      std::__cxx11::string::push_back(cVar9);
    }
  }
  if ((uVar6 >> 9 & 1) != 0) {
    paVar1 = &local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar1;
    if ((uVar6 >> 8 & 1) != 0) {
      std::__cxx11::string::push_back((char)&local_70);
    }
    std::__cxx11::string::append((char *)&local_70);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"${CONFIGURATION}","");
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::Shell_GetArgument(cm::string_view in, int flags)
{
  /* Output will be at least as long as input string.  */
  std::string out;
  out.reserve(in.size());

  /* Keep track of how many backslashes have been encountered in a row.  */
  int windows_backslashes = 0;

  /* Whether the argument must be quoted.  */
  int needQuotes = Shell_ArgumentNeedsQuotes(in, flags);
  if (needQuotes) {
    /* Add the opening quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      if (flags & Shell_Flag_IsUnix) {
        out += '"';
      }
      out += '\'';
    } else {
      out += '"';
    }
  }

  /* Scan the string for characters that require escaping or quoting.  */
  for (cm::string_view::iterator cit = in.begin(), cend = in.end();
       cit != cend; ++cit) {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if (flags & Shell_Flag_AllowMakeVariables) {
      cm::string_view::iterator skip = Shell_SkipMakeVariables(cit, cend);
      if (skip != cit) {
        /* Copy to the end of the make variable references.  */
        while (cit != skip) {
          out += *cit++;
        }

        /* The make variable reference eliminates any escaping needed
           for preceding backslashes.  */
        windows_backslashes = 0;

        /* Stop if we have reached the end of the string.  */
        if (cit == cend) {
          break;
        }
      }
    }

    /* Check whether this character needs escaping for the shell.  */
    if (flags & Shell_Flag_IsUnix) {
      /* On Unix a few special characters need escaping even inside a
         quoted argument.  */
      if (*cit == '\\' || *cit == '"' || *cit == '`' || *cit == '$') {
        /* This character needs a backslash to escape it.  */
        out += '\\';
      }
    } else if (flags & Shell_Flag_EchoWindows) {
      /* On Windows the built-in command shell echo never needs escaping.  */
    } else {
      /* On Windows only backslashes and double-quotes need escaping.  */
      if (*cit == '\\') {
        /* Found a backslash.  It may need to be escaped later.  */
        ++windows_backslashes;
      } else if (*cit == '"') {
        /* Found a double-quote.  Escape all immediately preceding
           backslashes.  */
        while (windows_backslashes > 0) {
          --windows_backslashes;
          out += '\\';
        }

        /* Add the backslash to escape the double-quote.  */
        out += '\\';
      } else {
        /* We encountered a normal character.  This eliminates any
           escaping needed for preceding backslashes.  */
        windows_backslashes = 0;
      }
    }

    /* Check whether this character needs escaping for a make tool.  */
    if (*cit == '$') {
      if (flags & Shell_Flag_Make) {
        /* In Makefiles a dollar is written $$.  The make tool will
           replace it with just $ before passing it to the shell.  */
        out += "$$";
      } else if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a dollar is written "$".  If this is written in
           an un-quoted argument it starts a quoted segment, inserts
           the $ and ends the segment.  If it is written in a quoted
           argument it ends quoting, inserts the $ and restarts
           quoting.  Either way the $ is isolated from surrounding
           text to avoid looking like a variable reference.  */
        out += "\"$\"";
      } else {
        /* Otherwise a dollar is written just $. */
        out += '$';
      }
    } else if (*cit == '#') {
      if ((flags & Shell_Flag_Make) && (flags & Shell_Flag_WatcomWMake)) {
        /* In Watcom WMake makefiles a pound is written $#.  The make
           tool will replace it with just # before passing it to the
           shell.  */
        out += "$#";
      } else {
        /* Otherwise a pound is written just #. */
        out += '#';
      }
    } else if (*cit == '%') {
      if ((flags & Shell_Flag_VSIDE) ||
          ((flags & Shell_Flag_Make) &&
           ((flags & Shell_Flag_MinGWMake) || (flags & Shell_Flag_NMake)))) {
        /* In the VS IDE, NMake, or MinGW make a percent is written %%.  */
        out += "%%";
      } else {
        /* Otherwise a percent is written just %. */
        out += '%';
      }
    } else if (*cit == ';') {
      if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a semicolon is written ";".  If this is written
           in an un-quoted argument it starts a quoted segment,
           inserts the ; and ends the segment.  If it is written in a
           quoted argument it ends quoting, inserts the ; and restarts
           quoting.  Either way the ; is isolated.  */
        out += "\";\"";
      } else {
        /* Otherwise a semicolon is written just ;. */
        out += ';';
      }
    } else {
      /* Store this character.  */
      out += *cit;
    }
  }

  if (needQuotes) {
    /* Add enough backslashes to escape any trailing ones.  */
    while (windows_backslashes > 0) {
      --windows_backslashes;
      out += '\\';
    }

    /* Add the closing quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      out += '\'';
      if (flags & Shell_Flag_IsUnix) {
        out += '"';
      }
    } else {
      out += '"';
    }
  }

  if (flags & Shell_Flag_UnescapeNinjaConfiguration) {
    std::string ninjaConfigReplace;
    if (flags & Shell_Flag_IsUnix) {
      ninjaConfigReplace += '\\';
    }
    ninjaConfigReplace += "$${CONFIGURATION}";
    cmSystemTools::ReplaceString(out, ninjaConfigReplace, "${CONFIGURATION}");
  }

  return out;
}